

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime.c
# Opt level: O2

mp_int * provableprime_generate_inner
                   (ProvablePrimeContext *ppc,PrimeCandidateSource *pcs,ProgressReceiver *prog,
                   double progress_origin,double progress_scale)

{
  double dVar1;
  SubprimePolicy SVar2;
  Pockle *pockle;
  ProgressReceiver *pPVar3;
  uint uVar4;
  PockleStatus PVar5;
  uint uVar6;
  uint uVar7;
  mp_int *pmVar8;
  mp_int **ppmVar9;
  mp_int *pmVar10;
  mp_int *x;
  mp_int *pmVar11;
  mp_int *x_00;
  size_t sVar12;
  void *ptr;
  double dVar13;
  uint *ptr_00;
  PrimeCandidateSource *pcs_00;
  MillerRabin *mr;
  mp_int *to_free;
  PrimeCandidateSource *s;
  uint uVar14;
  size_t i;
  ulong uVar15;
  ProvablePrimeContext *ppc_00;
  mp_int *to_free_1;
  uint uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double local_90;
  size_t nfactors;
  double local_80;
  uint local_74;
  ProvablePrimeContext *local_70;
  double local_68;
  uint local_60;
  uint local_5c;
  PrimeCandidateSource *local_58;
  ProgressReceiver *local_50;
  double local_48;
  double local_40;
  size_t ssize;
  
  local_70 = ppc;
  local_48 = progress_scale;
  local_40 = progress_origin;
  local_74 = pcs_get_bits(pcs);
  if (local_74 < 2) {
    __assert_fail("bits > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/prime.c"
                  ,0x14a,
                  "mp_int *provableprime_generate_inner(ProvablePrimeContext *, PrimeCandidateSource *, ProgressReceiver *, double, double)"
                 );
  }
  if (local_74 < 0x21) {
    pockle = local_70->pockle;
    uVar4 = pcs_get_bits(pcs);
    if (uVar4 < 0x21) {
      pcs_ready(pcs);
      while ((pmVar8 = pcs_generate(pcs), pmVar8 != (mp_int *)0x0 &&
             (PVar5 = pockle_add_small_prime(pockle,pmVar8), PVar5 != POCKLE_OK))) {
        mp_free(pmVar8);
      }
      pcs_free(pcs);
      return pmVar8;
    }
    __assert_fail("pcs_get_bits(pcs) <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/prime.c"
                  ,0x104,"mp_int *primegen_small(Pockle *, PrimeCandidateSource *)");
  }
  pmVar8 = mp_from_integer(1);
  ppmVar9 = pcs_get_known_prime_factors(pcs,&nfactors);
  for (uVar15 = 0; uVar15 < nfactors; uVar15 = uVar15 + 1) {
    pmVar10 = mp_mul(pmVar8,ppmVar9[uVar15]);
    pmVar10 = mp_unsafe_shrink(pmVar10);
    mp_free(pmVar8);
    pmVar8 = pmVar10;
  }
  local_50 = prog;
  pmVar10 = pcs_get_upper_bound(pcs);
  x = mp_nthroot(pmVar10,3,(mp_int *)0x0);
  pmVar11 = mp_div(pmVar10,pmVar8);
  pmVar11 = mp_unsafe_shrink(pmVar11);
  uVar14 = 0;
  mp_free(pmVar10);
  pmVar10 = mp_add(x,pmVar8);
  mp_sub_integer_into(pmVar10,pmVar10,1);
  x_00 = mp_div(pmVar10,pmVar8);
  mp_free(pmVar10);
  pmVar10 = mp_unsafe_shrink(x_00);
  mp_free(x);
  local_58 = pcs;
  uVar4 = pcs_get_bits_remaining(pcs);
  uVar6 = mp_hs_integer(pmVar10,2);
  if (uVar6 != 0) {
    sVar12 = mp_get_nbits(pmVar10);
    uVar14 = (int)sVar12 + 1;
  }
  mp_free(pmVar11);
  mp_free(pmVar10);
  mp_free(pmVar8);
  s = local_58;
  ppc_00 = local_70;
  if (uVar14 == 0) goto LAB_00116021;
  nfactors = 0;
  uVar7 = uVar4 >> 1;
  uVar6 = 0;
  if (0x13 < uVar4) {
    uVar6 = uVar4 - 0x14;
  }
  uVar16 = uVar14;
  if (uVar14 < uVar7) {
    uVar16 = uVar7;
  }
  if (uVar6 <= uVar16) {
    uVar6 = uVar16;
  }
  SVar2 = local_70->extra->spp;
  if (SVar2 == SPP_MAURER_COMPLEX) {
    if (uVar7 < uVar6) {
      ssize = 0;
      local_60 = uVar6 + 1;
      ptr = (void *)0x0;
      ptr_00 = (uint *)0x0;
      local_5c = uVar16;
      do {
        dVar19 = 0.0;
        local_80 = 1.0;
LAB_00115db9:
        local_68 = uniform_random_double();
        local_68 = local_68 * local_80;
        local_80 = local_80 - local_68;
        ptr = safegrowarray(ptr,&ssize,8,(size_t)dVar19,1,false);
        dVar17 = dVar19;
        while ((dVar17 != 0.0 &&
               (dVar18 = *(double *)((long)ptr + ((long)dVar17 - 1U) * 8), dVar18 < local_68))) {
          *(double *)((long)ptr + (long)dVar17 * 8) = dVar18;
          dVar17 = (double)((long)dVar17 - 1U);
        }
        *(double *)((long)ptr + (long)dVar17 * 8) = local_68;
        dVar19 = (double)((long)dVar19 + 1);
        dVar18 = 0.0;
        dVar17 = 0.0;
        do {
          dVar13 = dVar17;
          if (dVar19 == dVar13) goto LAB_00115db9;
          dVar1 = *(double *)((long)ptr + (long)dVar13 * 8);
          dVar18 = dVar18 + dVar1;
          dVar17 = (double)((long)dVar13 + 1U);
        } while (dVar1 + dVar18 <= 1.0);
        uVar14 = 0;
        uVar6 = 0;
        local_80 = (double)((long)dVar13 + 1U);
        for (sVar12 = 0; (long)dVar13 + 1U != sVar12; sVar12 = sVar12 + 1) {
          dVar19 = *(double *)((long)ptr + sVar12 * 8);
          ptr_00 = (uint *)safegrowarray(ptr_00,&nfactors,4,sVar12,1,false);
          uVar7 = (uint)(long)(dVar19 * (double)uVar4 + 1.0);
          ptr_00[sVar12] = uVar7;
          uVar14 = (uVar14 + uVar7) - 1;
          uVar6 = uVar6 + uVar7;
        }
        if ((local_5c <= uVar14) && (uVar6 <= local_60)) {
          smemclr(ptr,ssize << 3);
          safefree(ptr);
          s = local_58;
          ppc_00 = local_70;
          dVar19 = local_80;
          goto LAB_00115f5f;
        }
      } while( true );
    }
LAB_00115ef9:
    do {
      do {
        dVar19 = uniform_random_double();
        dVar19 = exp2(dVar19 + -1.0);
        uVar14 = (uint)(long)(dVar19 * (double)uVar6 + 0.5);
      } while (uVar14 < uVar16);
    } while (uVar6 < uVar14);
  }
  else {
    if (SVar2 == SPP_MAURER_SIMPLE) goto LAB_00115ef9;
    if (SVar2 != SPP_FAST) {
      __assert_fail("false && \"bad subprime policy\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/prime.c"
                    ,0x261,
                    "mp_int *provableprime_generate_inner(ProvablePrimeContext *, PrimeCandidateSource *, ProgressReceiver *, double, double)"
                   );
    }
  }
  ptr_00 = (uint *)safegrowarray((void *)0x0,&nfactors,4,0,1,false);
  *ptr_00 = uVar14;
  dVar19 = 4.94065645841247e-324;
LAB_00115f5f:
  local_68 = (double)local_74;
  local_90 = 0.0;
  for (dVar17 = 0.0; dVar19 != dVar17; dVar17 = (double)((long)dVar17 + 1)) {
    local_80 = (double)ptr_00[(long)dVar17] / local_68;
    pcs_00 = pcs_new(ptr_00[(long)dVar17]);
    pmVar8 = provableprime_generate_inner
                       (ppc_00,pcs_00,local_50,local_48 * local_90 + local_40,local_80 * local_48);
    if (pmVar8 == (mp_int *)0x0) {
      __assert_fail("q",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/prime.c"
                    ,0x26c,
                    "mp_int *provableprime_generate_inner(ProvablePrimeContext *, PrimeCandidateSource *, ProgressReceiver *, double, double)"
                   );
    }
    local_90 = local_90 + local_80;
    pcs_require_residue_1_mod_prime(s,pmVar8);
    mp_free(pmVar8);
  }
  smemclr(ptr_00,nfactors << 2);
  safefree(ptr_00);
LAB_00116021:
  pcs_ready(s);
  pPVar3 = local_50;
  while( true ) {
    while( true ) {
      pmVar8 = pcs_generate(s);
      if (pmVar8 == (mp_int *)0x0) {
        pcs_free(s);
        return (mp_int *)0x0;
      }
      mr = miller_rabin_new(pmVar8);
      pmVar10 = miller_rabin_find_potential_primitive_root(mr);
      miller_rabin_free(mr);
      if (pmVar10 != (mp_int *)0x0) break;
      mp_free(pmVar8);
    }
    ppmVar9 = pcs_get_known_prime_factors(s,&nfactors);
    PVar5 = pockle_add_prime(local_70->pockle,pmVar8,ppmVar9,nfactors,pmVar10);
    if (PVar5 == POCKLE_OK) break;
    if (2 < PVar5 - POCKLE_DISCRIMINANT_IS_SQUARE) {
      __assert_fail("st == POCKLE_DISCRIMINANT_IS_SQUARE || st == POCKLE_WITNESS_POWER_IS_1 || st == POCKLE_WITNESS_POWER_NOT_COPRIME"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/prime.c"
                    ,0x2a2,
                    "mp_int *provableprime_generate_inner(ProvablePrimeContext *, PrimeCandidateSource *, ProgressReceiver *, double, double)"
                   );
    }
    mp_free(pmVar8);
    mp_free(pmVar10);
  }
  mp_free(pmVar10);
  pcs_free(s);
  (*pPVar3->vt->report)(pPVar3,local_40 + local_48);
  return pmVar8;
}

Assistant:

static mp_int *provableprime_generate_inner(
    ProvablePrimeContext *ppc, PrimeCandidateSource *pcs,
    ProgressReceiver *prog, double progress_origin, double progress_scale)
{
    unsigned bits = pcs_get_bits(pcs);
    assert(bits > 1);

    if (bits <= 32) {
        debug_f("ppgi(%u) -> small", bits);
        return primegen_small(ppc->pockle, pcs);
    }

    unsigned min_bits_needed, max_bits_needed;
    {
        /*
         * Find the product of all the prime factors we already know
         * about.
         */
        mp_int *size_got = mp_from_integer(1);
        size_t nfactors;
        mp_int **factors = pcs_get_known_prime_factors(pcs, &nfactors);
        for (size_t i = 0; i < nfactors; i++) {
            mp_int *to_free = size_got;
            size_got = mp_unsafe_shrink(mp_mul(size_got, factors[i]));
            mp_free(to_free);
        }

        /*
         * Find the largest cofactor we might be able to use, and the
         * smallest one we can get away with.
         */
        mp_int *upperbound = pcs_get_upper_bound(pcs);
        mp_int *size_needed = mp_nthroot(upperbound, 3, NULL);
        debug_f_mp("upperbound = ", upperbound);
        {
            mp_int *to_free = upperbound;
            upperbound = mp_unsafe_shrink(mp_div(upperbound, size_got));
            mp_free(to_free);
        }
        debug_f_mp("size_needed = ", size_needed);
        {
            mp_int *to_free = size_needed;
            size_needed = mp_unsafe_shrink(mp_ceil_div(size_needed, size_got));
            mp_free(to_free);
        }

        max_bits_needed = pcs_get_bits_remaining(pcs);

        /*
         * We need a prime that is greater than or equal to
         * 'size_needed' in order for the product of all our known
         * factors of p-1 to exceed the cube root of the largest value
         * p might take.
         *
         * Since pcs_new wants a size specified in bits, we must count
         * the bits in size_needed and then add 1. Otherwise we might
         * get a value with the same bit count as size_needed but
         * slightly smaller than it.
         *
         * An exception is if size_needed = 1. In that case the
         * product of existing known factors is _already_ enough, so
         * we don't need to generate an extra factor at all.
         */
        if (mp_hs_integer(size_needed, 2)) {
            min_bits_needed = mp_get_nbits(size_needed) + 1;
        } else {
            min_bits_needed = 0;
        }

        mp_free(upperbound);
        mp_free(size_needed);
        mp_free(size_got);
    }

    double progress = 0.0;

    if (min_bits_needed) {
        debug_f("ppgi(%u) recursing, need [%u,%u] more bits",
                bits, min_bits_needed, max_bits_needed);

        unsigned *sizes = NULL;
        size_t nsizes = 0, sizesize = 0;

        unsigned real_min = max_bits_needed / 2;
        unsigned real_max = (max_bits_needed >= 20 ?
                             max_bits_needed - 20 : 0);
        if (real_min < min_bits_needed)
            real_min = min_bits_needed;
        if (real_max < real_min)
            real_max = real_min;
        debug_f("ppgi(%u) revised bits interval = [%u,%u]",
                bits, real_min, real_max);

        switch (ppc->extra->spp) {
          case SPP_FAST:
            /*
             * Always pick the smallest subsidiary prime we can get
             * away with: just over n/3 bits.
             *
             * This is not a good mode for cryptographic prime
             * generation, because it skews the distribution of primes
             * greatly, and worse, it skews them in a direction that
             * heads away from the properties crypto algorithms tend
             * to like.
             *
             * (For both discrete-log systems and RSA, people have
             * tended to recommend in the past that p-1 should have a
             * _large_ factor if possible. There's some disagreement
             * on which algorithms this is really necessary for, but
             * certainly I've never seen anyone recommend arranging a
             * _small_ factor on purpose.)
             *
             * I originally implemented this mode because it was
             * convenient for debugging - it wastes as little time as
             * possible on finding a sub-prime and lets you get to the
             * interesting part! And I leave it in the code because it
             * might still be useful for _something_. Because it's
             * cryptographically questionable, it's not selectable in
             * the UI of either version of PuTTYgen proper; but it can
             * be accessed through testcrypt, and if for some reason a
             * definite prime is needed for non-crypto purposes, it
             * may still be the fastest way to put your hands on one.
             */
            debug_f("ppgi(%u) fast mode, just ask for %u bits",
                    bits, min_bits_needed);
            sgrowarray(sizes, sizesize, nsizes);
            sizes[nsizes++] = min_bits_needed;
            break;
          case SPP_MAURER_SIMPLE: {
            /*
             * Select the size of the subsidiary prime at random from
             * sqrt(outputprime) up to outputprime/2^20, in such a way
             * that the probability distribution matches that of the
             * largest prime factor of a random n-bit number.
             *
             * Per [MAURER] section 3.4, the cumulative distribution
             * function of this relative size is 1+log2(x), for x in
             * [1/2,1]. You can generate a value from the distribution
             * given by a cdf by applying the inverse cdf to a uniform
             * value in [0,1]. Simplifying that in this case, what we
             * have to do is raise 2 to the power of a random real
             * number between -1 and 0. (And that gives you the number
             * of _bits_ in the sub-prime, as a factor of the desired
             * output number of bits.)
             *
             * We also require that the subsidiary prime q is at least
             * 20 bits smaller than the output one, to give us a
             * fighting chance of there being _any_ prime we can find
             * such that q | p-1.
             *
             * (But these rules have to be applied in an order that
             * still leaves us _some_ interval of possible sizes we
             * can pick!)
             */
          maurer_simple:
            debug_f("ppgi(%u) Maurer simple mode", bits);

            unsigned sub_bits;
            do {
                double uniform = uniform_random_double();
                sub_bits = real_max * pow(2.0, uniform - 1) + 0.5;
                debug_f(" ... %.6f -> %u?", uniform, sub_bits);
            } while (!(real_min <= sub_bits && sub_bits <= real_max));

            debug_f("ppgi(%u) asking for %u bits", bits, sub_bits);
            sgrowarray(sizes, sizesize, nsizes);
            sizes[nsizes++] = sub_bits;

            break;
          }
          case SPP_MAURER_COMPLEX: {
            /*
             * In this mode, we may generate multiple factors of p-1
             * which between them add up to at least n/2 bits, in such
             * a way that those are guaranteed to be the largest
             * factors of p-1 and that they have the same probability
             * distribution as the largest k factors would have in a
             * random integer. The idea is that this more elaborate
             * procedure gets as close as possible to the same
             * probability distribution you'd get by selecting a
             * completely random prime (if you feasibly could).
             *
             * Algorithm from Appendix 1 of [MAURER]: we generate
             * random real numbers that sum to at most 1, by choosing
             * each one uniformly from the range [0, 1 - sum of all
             * the previous ones]. We maintain them in a list in
             * decreasing order, and we stop as soon as we find an
             * initial subsequence of the list s_1,...,s_r such that
             * s_1 + ... + s_{r-1} + 2 s_r > 1. In particular, this
             * guarantees that the sum of that initial subsequence is
             * at least 1/2, so we end up with enough factors to
             * satisfy Pocklington.
             */

            if (max_bits_needed / 2 + 1 > real_max) {
                /* Early exit path in the case where this algorithm
                 * can't possibly generate a value in the range we
                 * need. In that situation, fall back to Maurer
                 * simple. */
                debug_f("ppgi(%u) skipping GenerateSizeList, "
                        "real_max too small", bits);
                goto maurer_simple;    /* sorry! */
            }

            double *s = NULL;
            size_t ns, ssize = 0;

            while (true) {
                debug_f("ppgi(%u) starting GenerateSizeList", bits);
                ns = 0;
                double range = 1.0;
                while (true) {
                    /* Generate the next number */
                    double u = uniform_random_double() * range;
                    range -= u;
                    debug_f("  u_%"SIZEu" = %g", ns, u);

                    /* Insert it in the list */
                    sgrowarray(s, ssize, ns);
                    size_t i;
                    for (i = ns; i > 0 && s[i-1] < u; i--)
                        s[i] = s[i-1];
                    s[i] = u;
                    ns++;
                    debug_f("    inserting as s[%"SIZEu"]", i);

                    /* Look for a suitable initial subsequence */
                    double sum = 0;
                    for (i = 0; i < ns; i++) {
                        sum += s[i];
                        if (sum + s[i] > 1.0) {
                            debug_f("  s[0..%"SIZEu"] works!", i);

                            /* Truncate the sequence here, and stop
                             * generating random real numbers. */
                            ns = i+1;
                            goto got_list;
                        }
                    }
                }

              got_list:;
                /*
                 * Now translate those real numbers into actual bit
                 * counts, and do a last-minute check to make sure
                 * their product is going to be in range.
                 *
                 * We have to check both the min and max sizes of the
                 * total. A b-bit number is in [2^{b-1},2^b). So the
                 * product of numbers of sizes b_1,...,b_k is at least
                 * 2^{\sum (b_i-1)}, and less than 2^{\sum b_i}.
                 */
                nsizes = 0;

                unsigned min_total = 0, max_total = 0;

                for (size_t i = 0; i < ns; i++) {
                    /* These sizes are measured in actual entropy, so
                     * add 1 bit each time to account for the
                     * zero-information leading 1 */
                    unsigned this_size = max_bits_needed * s[i] + 1;
                    debug_f("  bits[%"SIZEu"] = %u", i, this_size);
                    sgrowarray(sizes, sizesize, nsizes);
                    sizes[nsizes++] = this_size;

                    min_total += this_size - 1;
                    max_total += this_size;
                }

                debug_f("  total bits = [%u,%u)", min_total, max_total);
                if (min_total < real_min || max_total > real_max+1) {
                    debug_f("  total out of range, try again");
                } else {
                    debug_f("  success! %"SIZEu" sub-primes totalling [%u,%u) "
                            "bits", nsizes, min_total, max_total);
                    break;
                }
            }

            smemclr(s, ssize * sizeof(*s));
            sfree(s);
            break;
          }
          default:
            unreachable("bad subprime policy");
        }

        for (size_t i = 0; i < nsizes; i++) {
            unsigned sub_bits = sizes[i];
            double progress_in_this_prime = (double)sub_bits / bits;
            mp_int *q = provableprime_generate_inner(
                ppc, pcs_new(sub_bits),
                prog, progress_origin + progress_scale * progress,
                progress_scale * progress_in_this_prime);
            progress += progress_in_this_prime;
            assert(q);
            debug_f_mp("ppgi(%u) got factor ", q, bits);
            pcs_require_residue_1_mod_prime(pcs, q);
            mp_free(q);
        }

        smemclr(sizes, sizesize * sizeof(*sizes));
        sfree(sizes);
    } else {
        debug_f("ppgi(%u) no need to recurse", bits);
    }

    debug_f("ppgi(%u) ready, %u bits remaining",
            bits, pcs_get_bits_remaining(pcs));
    pcs_ready(pcs);

    while (true) {
        mp_int *p = pcs_generate(pcs);
        if (!p) {
            pcs_free(pcs);
            return NULL;
        }

        debug_f_mp("provable_step p=", p);

        MillerRabin *mr = miller_rabin_new(p);
        debug_f("provable_step mr setup done");
        mp_int *witness = miller_rabin_find_potential_primitive_root(mr);
        miller_rabin_free(mr);

        if (!witness) {
            debug_f("provable_step mr failed");
            mp_free(p);
            continue;
        }

        size_t nfactors;
        mp_int **factors = pcs_get_known_prime_factors(pcs, &nfactors);
        PockleStatus st = pockle_add_prime(
            ppc->pockle, p, factors, nfactors, witness);

        if (st != POCKLE_OK) {
            debug_f("provable_step proof failed %d", (int)st);

            /*
             * Check by assertion that the error status is not one of
             * the ones we ought to have ruled out already by
             * construction. If there's a bug in this code that means
             * we can _never_ pass this test (e.g. picking products of
             * factors that never quite reach cbrt(n)), we'd rather
             * fail an assertion than loop forever.
             */
            assert(st == POCKLE_DISCRIMINANT_IS_SQUARE ||
                   st == POCKLE_WITNESS_POWER_IS_1 ||
                   st == POCKLE_WITNESS_POWER_NOT_COPRIME);

            mp_free(p);
            if (witness)
                mp_free(witness);
            continue;
        }

        mp_free(witness);
        pcs_free(pcs);
        debug_f_mp("ppgi(%u) done, got ", p, bits);
        progress_report(prog, progress_origin + progress_scale);
        return p;
    }
}